

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeAtomicNotify
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Name *mem,Memarg memarg)

{
  __index_type *__return_storage_ptr___00;
  Name *pNVar1;
  bool bVar2;
  Address local_f0;
  Result<wasm::Ok> local_e8;
  uint local_bc;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> m;
  Name *mem_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  __return_storage_ptr___00 =
       &_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index;
  getMemory((Result<wasm::Name> *)__return_storage_ptr___00,this,pos,mem);
  Result<wasm::Name>::Result
            ((Result<wasm::Name> *)local_80,(Result<wasm::Name> *)__return_storage_ptr___00);
  local_98 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_80);
  bVar2 = local_98 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  local_bc = (uint)bVar2;
  Result<wasm::Name>::~Result((Result<wasm::Name> *)local_80);
  if (local_bc == 0) {
    wasm::Address::Address(&local_f0,memarg.offset);
    pNVar1 = Result<wasm::Name>::operator*
                       ((Result<wasm::Name> *)
                        &_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index);
    IRBuilder::makeAtomicNotify
              (&local_e8,&this->irBuilder,local_f0,(Name)(pNVar1->super_IString).str);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_e8);
    Result<wasm::Ok>::~Result(&local_e8);
    local_bc = 1;
  }
  Result<wasm::Name>::~Result
            ((Result<wasm::Name> *)
             &_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
              super__Move_assign_alias<wasm::Name,_wasm::Err>.
              super__Copy_assign_alias<wasm::Name,_wasm::Err>.
              super__Move_ctor_alias<wasm::Name,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
              super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_index);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicNotify(Index pos,
                            const std::vector<Annotation>& annotations,
                            Name* mem,
                            Memarg memarg) {
    auto m = getMemory(pos, mem);
    CHECK_ERR(m);
    return withLoc(pos, irBuilder.makeAtomicNotify(memarg.offset, *m));
  }